

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O3

bool __thiscall CLI::App::_process_config_file(App *this,string *config_file,bool throw_error)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  ConfigError *__return_storage_ptr__;
  FileError *__return_storage_ptr___00;
  pointer item;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> values;
  stat buffer;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> local_f0;
  string local_d8;
  stat local_b8;
  
  iVar3 = stat((config_file->_M_dataplus)._M_p,&local_b8);
  if ((local_b8.st_mode & 0x4000) == 0 && iVar3 == 0) {
    Config::from_file(&local_f0,
                      (this->config_formatter_).
                      super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr,config_file
                     );
    for (item = local_f0.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>.
                _M_impl.super__Vector_impl_data._M_start;
        item != local_f0.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>.
                _M_impl.super__Vector_impl_data._M_finish; item = item + 1) {
      bVar2 = _parse_single_config(this,item,0);
      if (!bVar2 && this->allow_config_extras_ == error) {
        __return_storage_ptr__ = (ConfigError *)__cxa_allocate_exception(0x38);
        ConfigItem::fullname_abi_cxx11_((string *)&local_b8,item);
        ConfigError::Extras(__return_storage_ptr__,(string *)&local_b8);
        __cxa_throw(__return_storage_ptr__,&ConfigError::typeinfo,Error::~Error);
      }
    }
    std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::~vector(&local_f0);
    bVar2 = true;
  }
  else {
    if (throw_error) {
      __return_storage_ptr___00 = (FileError *)__cxa_allocate_exception(0x38);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      pcVar1 = (config_file->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar1,pcVar1 + config_file->_M_string_length);
      FileError::Missing(__return_storage_ptr___00,&local_d8);
      __cxa_throw(__return_storage_ptr___00,&FileError::typeinfo,Error::~Error);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

CLI11_INLINE bool App::_process_config_file(const std::string &config_file, bool throw_error) {
    auto path_result = detail::check_path(config_file.c_str());
    if(path_result == detail::path_type::file) {
        try {
            std::vector<ConfigItem> values = config_formatter_->from_file(config_file);
            _parse_config(values);
            return true;
        } catch(const FileError &) {
            if(throw_error) {
                throw;
            }
            return false;
        }
    } else if(throw_error) {
        throw FileError::Missing(config_file);
    } else {
        return false;
    }
}